

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O3

int err_set_logfile(char *path)

{
  FILE *pFVar1;
  int iVar2;
  FILE *__stream;
  
  pFVar1 = fopen(path,"a");
  if (pFVar1 == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    if (logfp == (FILE *)0x0) {
      logfp = (FILE *)_stderr;
    }
    __stream = (FILE *)0x0;
    if (logfp_disabled == '\0') {
      __stream = (FILE *)logfp;
    }
    logfp_disabled = '\0';
    iVar2 = 0;
    logfp = (FILE *)pFVar1;
    if (__stream != _stderr && (__stream != _stdout && __stream != (FILE *)0x0)) {
      fclose(__stream);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
err_set_logfile(const char *path)
{
    FILE *newfp, *oldfp;

    if ((newfp = fopen(path, "a")) == NULL)
        return -1;
    oldfp = err_get_logfp();
    err_set_logfp(newfp);
    if (oldfp != NULL && oldfp != stdout && oldfp != stderr)
        fclose(oldfp);
    return 0;
}